

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::StringValue::_InternalSerialize
          (StringValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  char *in_R9;
  string *_s;
  string *s;
  string_view field_name;
  
  s = (string *)((ulong)(this->field_0)._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  if ((char *)s->_M_string_length != (char *)0x0) {
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.StringValue.value";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(s->_M_dataplus)._M_p,(char *)s->_M_string_length,1,0x21,field_name
              );
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* StringValue::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const StringValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.StringValue)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // string value = 1;
          if (!this_._internal_value().empty()) {
            const std::string& _s = this_._internal_value();
            ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
                _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.StringValue.value");
            target = stream->WriteStringMaybeAliased(1, _s, target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.StringValue)
          return target;
        }